

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase283::run(TestCase283 *this)

{
  PromiseArena *pPVar1;
  PromiseBase node;
  SegmentBuilder *pSVar2;
  CapTableBuilder *pCVar3;
  RequestHook *pRVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long *plVar7;
  OwnPromiseNode OVar8;
  PromiseFulfiller<void> *pPVar9;
  ClientHook *pCVar10;
  WeakFulfiller<void> *params;
  void *pvVar11;
  long *__n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  PromiseNode *ptrCopy;
  TransformPromiseNodeBase *pTVar12;
  int in_R8D;
  Own<capnp::ClientHook,_std::nullptr_t> OVar13;
  bool returned;
  bool destroyed;
  Promise<void> destructionPromise;
  Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  request;
  PromiseFulfillerPair<void> paf;
  Client client;
  WaitScope waitScope;
  int handleCount;
  int callCount;
  EventLoop loop;
  undefined1 local_1fa [2];
  PromiseBase local_1f8;
  Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  local_1f0;
  undefined1 local_1b8 [48];
  SegmentBuilder *local_188;
  long *local_180;
  OwnPromiseNode local_178;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> local_170;
  undefined1 local_160 [16];
  long *local_150;
  pointer_____offset_0x10___ *local_148;
  Client local_140;
  EventLoop *local_130;
  byte local_128 [8];
  long local_120;
  byte abStack_118 [8];
  OwnPromiseNode local_110;
  int local_108;
  int local_104;
  char *local_100;
  undefined *puStack_f8;
  byte local_f0 [8];
  char *local_e8;
  undefined *puStack_e0;
  byte local_d8 [8];
  char *local_d0;
  undefined *puStack_c8;
  byte local_c0 [8];
  Maybe<capnp::MessageSize> local_b8;
  EventLoop local_a0;
  
  kj::EventLoop::EventLoop(&local_a0);
  local_128[0] = 0xff;
  local_128[1] = 0xff;
  local_128[2] = 0xff;
  local_128[3] = 0xff;
  local_120 = 0;
  abStack_118[0] = '\0';
  abStack_118[1] = '\0';
  abStack_118[2] = '\0';
  abStack_118[3] = '\0';
  abStack_118[4] = '\0';
  abStack_118[5] = '\0';
  abStack_118[6] = '\0';
  abStack_118[7] = '\0';
  local_130 = &local_a0;
  kj::EventLoop::enterScope(&local_a0);
  params = (WeakFulfiller<void> *)operator_new(0x18);
  (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (params->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_006e1308;
  (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_006e1340;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
            ((PromiseDisposer *)&local_1f0,params);
  local_178.ptr = (PromiseNode *)local_1f0.super_Builder._builder.segment;
  local_1fa[1] = '\0';
  pPVar1 = *(PromiseArena **)&((local_1f0.super_Builder._builder.segment)->super_SegmentReader).id;
  local_170.disposer = &(params->super_WeakFulfillerBase).super_Disposer;
  local_170.ptr = (PromiseFulfiller<void> *)params;
  if (pPVar1 == (PromiseArena *)0x0 ||
      (ulong)((long)local_1f0.super_Builder._builder.segment - (long)pPVar1) < 0x28) {
    pvVar11 = operator_new(0x400);
    pTVar12 = (TransformPromiseNodeBase *)((long)pvVar11 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,&local_178,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:291:46)>
               ::anon_class_8_1_8c041cb9_for_func::operator());
    *(undefined ***)((long)pvVar11 + 0x3d8) = &PTR_destroy_006dfcb8;
    *(undefined1 **)((long)pvVar11 + 0x3f8) = local_1fa + 1;
    *(void **)((long)pvVar11 + 0x3e0) = pvVar11;
  }
  else {
    *(PromiseArena **)&((local_1f0.super_Builder._builder.segment)->super_SegmentReader).id =
         (PromiseArena *)0x0;
    pTVar12 = (TransformPromiseNodeBase *)
              &local_1f0.super_Builder._builder.segment[-1].super_SegmentReader.ptr;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,&local_178,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:291:46)>
               ::anon_class_8_1_8c041cb9_for_func::operator());
    local_1f0.super_Builder._builder.segment[-1].super_SegmentReader.ptr.ptr =
         (word *)&PTR_destroy_006dfcb8;
    *(undefined1 **)&local_1f0.super_Builder._builder.segment[-1].readOnly = local_1fa + 1;
    local_1f0.super_Builder._builder.segment[-1].super_SegmentReader.ptr.size_ = (size_t)pPVar1;
  }
  local_1f0.super_Builder._builder.segment = (SegmentBuilder *)0x4fd553;
  local_1f0.super_Builder._builder.capTable = (CapTableBuilder *)&DAT_004fd5db;
  local_1f0.super_Builder._builder.data = (void *)0x1d00000123;
  local_160._0_8_ = pTVar12;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::EagerPromiseNode<kj::_::Void>,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)local_1b8,(OwnPromiseNode *)local_160,(SourceLocation *)&local_1f0);
  uVar5 = local_160._0_8_;
  local_1f8.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_1b8._0_8_;
  if ((TransformPromiseNodeBase *)local_160._0_8_ != (TransformPromiseNodeBase *)0x0) {
    local_160._0_8_ = (TransformPromiseNodeBase *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar5);
  }
  local_104._0_1_ = '\0';
  local_104._1_1_ = '\0';
  local_104._2_1_ = '\0';
  local_104._3_1_ = '\0';
  local_108 = 0;
  kj::heap<capnp::_::TestMoreStuffImpl,int&,int&>((kj *)local_1b8,&local_104,&local_108);
  local_1f0.super_Builder._builder.segment = (SegmentBuilder *)local_1b8._0_8_;
  local_1f0.super_Builder._builder.capTable = (CapTableBuilder *)(local_1b8._8_8_ + 0x30);
  if ((Server *)local_1b8._8_8_ == (Server *)0x0) {
    local_1f0.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  }
  local_1b8._8_8_ = (Server *)0x0;
  OVar13 = Capability::Client::makeLocalClient
                     (&local_140,(Own<capnp::Capability::Server,_std::nullptr_t> *)&local_1f0);
  pCVar3 = local_1f0.super_Builder._builder.capTable;
  if ((Server *)local_1f0.super_Builder._builder.capTable != (Server *)0x0) {
    local_1f0.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_1f0.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_1f0.super_Builder._builder.segment,
      (_func_int *)
      ((long)&(pCVar3->super_CapTableReader)._vptr_CapTableReader +
      (long)(pCVar3->super_CapTableReader)._vptr_CapTableReader[-2]),OVar13.ptr);
  }
  uVar5 = local_1b8._8_8_;
  local_148 = &capnproto_test::capnp::test::TestMoreStuff::Client::typeinfo;
  if ((Server *)local_1b8._8_8_ != (Server *)0x0) {
    local_1b8._8_8_ = (Server *)0x0;
    (*(code *)((SegmentReader *)local_1b8._0_8_)->arena->_vptr_Arena)
              (local_1b8._0_8_,
               (_func_int *)((long)(_func_int ***)uVar5 + (long)(*(_func_int ***)uVar5)[-2]));
  }
  local_1fa[0] = '\0';
  local_b8.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::expectCancelRequest
            (&local_1f0,(Client *)&local_148,&local_b8);
  kj::heap<capnp::_::TestCapDestructor,kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>
            ((kj *)&local_188,&local_170);
  __n = local_180;
  local_1b8._0_8_ = local_188;
  local_1b8._8_8_ = (long)local_180 + 0x48;
  if (local_180 == (long *)0x0) {
    local_1b8._8_8_ = (Server *)0x0;
  }
  local_180 = (long *)0x0;
  OVar13 = Capability::Client::makeLocalClient
                     ((Client *)(local_160 + 8),
                      (Own<capnp::Capability::Server,_std::nullptr_t> *)local_1b8);
  uVar5 = local_1b8._8_8_;
  if ((Server *)local_1b8._8_8_ != (Server *)0x0) {
    local_1b8._8_8_ = (Server *)0x0;
    (*(code *)((SegmentReader *)local_1b8._0_8_)->arena->_vptr_Arena)
              (local_1b8._0_8_,
               (_func_int *)((long)(_func_int ***)uVar5 + (long)(*(_func_int ***)uVar5)[-2]),
               OVar13.ptr);
  }
  local_160._0_8_ = &Capability::Client::typeinfo;
  local_1b8._0_8_ = local_1f0.super_Builder._builder.segment;
  local_1b8._8_8_ = local_1f0.super_Builder._builder.capTable;
  local_1b8._16_8_ = local_1f0.super_Builder._builder.pointers;
  PointerBuilder::setCapability
            ((PointerBuilder *)local_1b8,(Own<capnp::ClientHook,_std::nullptr_t> *)(local_160 + 8));
  plVar7 = local_150;
  pvVar11 = extraout_RDX;
  if (local_150 != (long *)0x0) {
    local_150 = (long *)0x0;
    (*(code *)**(undefined8 **)local_160._8_8_)
              (local_160._8_8_,(long)plVar7 + *(long *)(*plVar7 + -0x10));
    pvVar11 = extraout_RDX_00;
  }
  plVar7 = local_180;
  if (local_180 != (long *)0x0) {
    local_180 = (long *)0x0;
    (*(code *)((local_188->super_SegmentReader).arena)->_vptr_Arena)
              (local_188,(long)plVar7 + *(long *)(*plVar7 + -0x10));
    pvVar11 = extraout_RDX_01;
  }
  Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
          *)local_1b8,(int)&local_1f0,pvVar11,(size_t)__n,in_R8D);
  uVar5 = local_1b8._0_8_;
  pPVar1 = *(PromiseArena **)&((SegmentReader *)local_1b8._0_8_)->id;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_1b8._0_8_ - (long)pPVar1) < 0x28) {
    pvVar11 = operator_new(0x400);
    pTVar12 = (TransformPromiseNodeBase *)((long)pvVar11 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)local_1b8,
               kj::_::
               SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:305:9)>
               ::anon_class_8_1_d59fe34d_for_func::operator());
    *(undefined ***)((long)pvVar11 + 0x3d8) = &PTR_destroy_006dfd10;
    *(undefined1 **)((long)pvVar11 + 0x3f8) = local_1fa;
    *(void **)((long)pvVar11 + 0x3e0) = pvVar11;
  }
  else {
    *(PromiseArena **)&((SegmentReader *)local_1b8._0_8_)->id = (PromiseArena *)0x0;
    pTVar12 = (TransformPromiseNodeBase *)&((PromiseArenaMember *)(local_1b8._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)local_1b8,
               kj::_::
               SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:305:9)>
               ::anon_class_8_1_d59fe34d_for_func::operator());
    ((PromiseArenaMember *)(uVar5 + -0x30))->arena = (PromiseArena *)&PTR_destroy_006dfd10;
    ((PromiseArenaMember *)(uVar5 + -0x10))->arena = (PromiseArena *)local_1fa;
    ((PromiseArenaMember *)(uVar5 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_160._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  local_160._8_8_ = &DAT_004fd5db;
  local_150 = (long *)0xf00000130;
  local_110.ptr = &pTVar12->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::EagerPromiseNode<kj::_::Void>,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_188,&local_110,(SourceLocation *)local_160);
  OVar8.ptr = local_110.ptr;
  if ((TransformPromiseNodeBase *)local_110.ptr != (TransformPromiseNodeBase *)0x0) {
    local_110.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar8.ptr)->super_PromiseArenaMember);
  }
  uVar6 = local_1b8._32_8_;
  uVar5 = local_1b8._24_8_;
  if ((WirePointer *)local_1b8._24_8_ != (WirePointer *)0x0) {
    local_1b8._24_8_ = (WirePointer *)0x0;
    local_1b8._32_4_ = 0;
    local_1b8._36_2_ = 0;
    local_1b8._38_2_ = 0;
    (***(_func_int ***)local_1b8._40_8_)(local_1b8._40_8_,uVar5,8,uVar6,uVar6,0);
  }
  uVar5 = local_1b8._16_8_;
  if ((WirePointer *)local_1b8._16_8_ != (WirePointer *)0x0) {
    local_1b8._16_8_ = (WirePointer *)0x0;
    (**((CapTableReader *)local_1b8._8_8_)->_vptr_CapTableReader)
              (local_1b8._8_8_,
               (long)&((WireValue<uint32_t>_conflict *)uVar5)->value +
               *(long *)((long)*(WirePointer *)uVar5 + -0x10));
  }
  uVar5 = local_1b8._0_8_;
  if ((SegmentBuilder *)local_1b8._0_8_ != (SegmentBuilder *)0x0) {
    local_1b8._0_8_ = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar5);
  }
  pRVar4 = local_1f0.hook.ptr;
  if (local_1f0.hook.ptr != (RequestHook *)0x0) {
    local_1f0.hook.ptr = (RequestHook *)0x0;
    (**(local_1f0.hook.disposer)->_vptr_Disposer)
              (local_1f0.hook.disposer,
               (_func_int *)((long)&pRVar4->_vptr_RequestHook + (long)pRVar4->_vptr_RequestHook[-2])
              );
  }
  kj::yield();
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  puStack_c8 = &DAT_004fd5db;
  local_c0[0] = '5';
  local_c0[1] = '\x01';
  local_c0[2] = '\0';
  local_c0[3] = '\0';
  local_c0[4] = '\x03';
  local_c0[5] = '\0';
  local_c0[6] = '\0';
  local_c0[7] = '\0';
  kj::Promise<void>::wait((Promise<void> *)&local_1f0,&local_130);
  pSVar2 = local_1f0.super_Builder._builder.segment;
  if (local_1f0.super_Builder._builder.segment != (SegmentBuilder *)0x0) {
    local_1f0.super_Builder._builder.segment = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pSVar2);
  }
  kj::yield();
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  puStack_e0 = &DAT_004fd5db;
  local_d8[0] = '6';
  local_d8[1] = '\x01';
  local_d8[2] = '\0';
  local_d8[3] = '\0';
  local_d8[4] = '\x03';
  local_d8[5] = '\0';
  local_d8[6] = '\0';
  local_d8[7] = '\0';
  kj::Promise<void>::wait((Promise<void> *)&local_1f0,&local_130);
  pSVar2 = local_1f0.super_Builder._builder.segment;
  if (local_1f0.super_Builder._builder.segment != (SegmentBuilder *)0x0) {
    local_1f0.super_Builder._builder.segment = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pSVar2);
  }
  local_1f0.super_Builder._builder.segment =
       (SegmentBuilder *)(CONCAT71(local_1f0.super_Builder._builder.segment._1_7_,local_1fa[1]) ^ 1)
  ;
  if ((local_1fa[1] != '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[30],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x139,ERROR,"\"failed: expected \" \"!(destroyed)\", _kjCondition",
               (char (*) [30])"failed: expected !(destroyed)",(DebugExpression<bool> *)&local_1f0);
  }
  local_1f0.super_Builder._builder.segment =
       (SegmentBuilder *)(CONCAT71(local_1f0.super_Builder._builder.segment._1_7_,local_1fa[0]) ^ 1)
  ;
  if ((local_1fa[0] != '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[29],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x13a,ERROR,"\"failed: expected \" \"!(returned)\", _kjCondition",
               (char (*) [29])"failed: expected !(returned)",(DebugExpression<bool> *)&local_1f0);
  }
  if (local_188 != (SegmentBuilder *)0x0) {
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)local_188);
  }
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  puStack_f8 = &DAT_004fd5db;
  local_f0[0] = '=';
  local_f0[1] = '\x01';
  local_f0[2] = '\0';
  local_f0[3] = '\0';
  local_f0[4] = '\x03';
  local_f0[5] = '\0';
  local_f0[6] = '\0';
  local_f0[7] = '\0';
  kj::Promise<void>::wait((Promise<void> *)&local_1f8,&local_130);
  local_1f0.super_Builder._builder.segment = (SegmentBuilder *)(local_1fa + 1);
  if ((local_1fa[1] == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[27],kj::_::DebugExpression<bool&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x13f,ERROR,"\"failed: expected \" \"destroyed\", _kjCondition",
               (char (*) [27])"failed: expected destroyed",(DebugExpression<bool_&> *)&local_1f0);
  }
  local_1f0.super_Builder._builder.segment =
       (SegmentBuilder *)(CONCAT71(local_1f0.super_Builder._builder.segment._1_7_,local_1fa[0]) ^ 1)
  ;
  if ((local_1fa[0] != '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[29],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x140,ERROR,"\"failed: expected \" \"!(returned)\", _kjCondition",
               (char (*) [29])"failed: expected !(returned)",(DebugExpression<bool> *)&local_1f0);
  }
  pCVar10 = local_140.hook.ptr;
  if (local_140.hook.ptr != (ClientHook *)0x0) {
    local_140.hook.ptr = (ClientHook *)0x0;
    (**(local_140.hook.disposer)->_vptr_Disposer)
              (local_140.hook.disposer,
               (_func_int *)((long)&pCVar10->_vptr_ClientHook + (long)pCVar10->_vptr_ClientHook[-2])
              );
  }
  node.node.ptr = local_1f8.node.ptr;
  if (local_1f8.node.ptr != (PromiseNode *)0x0) {
    local_1f8.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.node.ptr);
  }
  pPVar9 = local_170.ptr;
  if ((WeakFulfiller<void> *)local_170.ptr != (WeakFulfiller<void> *)0x0) {
    local_170.ptr = (PromiseFulfiller<void> *)0x0;
    (**((Disposer *)&(local_170.disposer)->_vptr_Disposer)->_vptr_Disposer)
              (local_170.disposer,
               (_func_int *)
               ((long)&(((PromiseFulfiller<void> *)&pPVar9->super_PromiseRejector)->
                       super_PromiseRejector)._vptr_PromiseRejector +
               (long)(((PromiseFulfiller<void> *)&pPVar9->super_PromiseRejector)->
                     super_PromiseRejector)._vptr_PromiseRejector[-2]));
  }
  OVar8.ptr = local_178.ptr;
  if ((SegmentBuilder *)local_178.ptr != (SegmentBuilder *)0x0) {
    local_178.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar8.ptr)->super_PromiseArenaMember);
  }
  if (local_120 == 0) {
    kj::EventLoop::leaveScope(local_130);
  }
  kj::EventLoop::~EventLoop(&local_a0);
  return;
}

Assistant:

TEST(Capability, AsyncCancelation) {
  // Tests cancellation.

  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  auto paf = kj::newPromiseAndFulfiller<void>();
  bool destroyed = false;
  auto destructionPromise = paf.promise.then([&]() { destroyed = true; }).eagerlyEvaluate(nullptr);

  int callCount = 0;
  int handleCount = 0;

  test::TestMoreStuff::Client client(kj::heap<TestMoreStuffImpl>(callCount, handleCount));

  kj::Promise<void> promise = nullptr;

  bool returned = false;
  {
    auto request = client.expectCancelRequest();
    request.setCap(test::TestInterface::Client(kj::heap<TestCapDestructor>(kj::mv(paf.fulfiller))));
    promise = request.send().then(
        [&](Response<test::TestMoreStuff::ExpectCancelResults>&& response) {
      returned = true;
    }).eagerlyEvaluate(nullptr);
  }
  kj::yield().wait(waitScope);
  kj::yield().wait(waitScope);

  // We can detect that the method was canceled because it will drop the cap.
  EXPECT_FALSE(destroyed);
  EXPECT_FALSE(returned);

  promise = nullptr;  // request cancellation
  destructionPromise.wait(waitScope);

  EXPECT_TRUE(destroyed);
  EXPECT_FALSE(returned);
}